

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

shared_ptr<mocker::ast::BuiltinType> __thiscall
mocker::Parser::builtinType(Parser *this,TokIter *iter,TokIter end)

{
  size_t *this_00;
  pointer this_01;
  TokIter in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<mocker::ast::BuiltinType> sVar2;
  TokIter *local_b0;
  anon_class_24_3_75efcddc mk;
  pair<mocker::Position,_mocker::Position> local_88;
  undefined1 local_68 [8];
  Position posEnd;
  Position posBeg;
  GetTokenID local_38;
  TokenID local_2c;
  TokIter TStack_28;
  TokenID id;
  TokIter *iter_local;
  Parser *this_local;
  TokIter end_local;
  
  TStack_28._M_current = end._M_current;
  iter_local = iter;
  end_local._M_current = (Token *)this;
  GetTokenID::GetTokenID(&local_38,in_RCX);
  local_2c = GetTokenID::operator()(&local_38,*TStack_28._M_current);
  if (((local_2c == Bool) || (local_2c == Int)) || (local_2c == String)) {
    this_00 = &posEnd.col;
    Position::Position((Position *)this_00);
    Position::Position((Position *)local_68);
    this_01 = __gnu_cxx::
              __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
              ::operator->((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                            *)TStack_28._M_current);
    Token::position(&local_88,this_01);
    std::tie<mocker::Position,mocker::Position>((Position *)&mk.posEnd,(Position *)this_00);
    std::tuple<mocker::Position&,mocker::Position&>::operator=
              ((tuple<mocker::Position&,mocker::Position&> *)&mk.posEnd,&local_88);
    local_b0 = iter;
    mk.this = (Parser *)this_00;
    mk.posBeg = (Position *)local_68;
    __gnu_cxx::
    __normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
    ::operator++((__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>
                  *)TStack_28._M_current);
    if (local_2c == Bool) {
      sVar2 = builtinType::anon_class_24_3_75efcddc::operator()
                        ((anon_class_24_3_75efcddc *)this,(Type)&local_b0);
      _Var1 = sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else if (local_2c == Int) {
      sVar2 = builtinType::anon_class_24_3_75efcddc::operator()
                        ((anon_class_24_3_75efcddc *)this,(Type)&local_b0);
      _Var1 = sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      if (local_2c != String) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/parse/parser.cpp"
                      ,0x3c,
                      "std::shared_ptr<ast::BuiltinType> mocker::Parser::builtinType(TokIter &, TokIter)"
                     );
      }
      sVar2 = builtinType::anon_class_24_3_75efcddc::operator()
                        ((anon_class_24_3_75efcddc *)this,(Type)&local_b0);
      _Var1 = sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
  }
  else {
    std::shared_ptr<mocker::ast::BuiltinType>::shared_ptr
              ((shared_ptr<mocker::ast::BuiltinType> *)this,(nullptr_t)0x0);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::BuiltinType>)
         sVar2.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::BuiltinType> Parser::builtinType(TokIter &iter,
                                                      TokIter end) {
  auto id = GetTokenID(end)(iter);
  if (id != TokenID::Bool && id != TokenID::Int && id != TokenID::String) {
    return nullptr;
  }

  Position posBeg, posEnd;
  std::tie(posBeg, posEnd) = iter->position();
  auto mk = [this, &posBeg, &posEnd](ast::BuiltinType::Type ty) {
    return makeNode<ast::BuiltinType>(posBeg, posEnd, ty);
  };

  ++iter;
  switch (id) {
  case TokenID::Bool:
    return mk(ast::BuiltinType::Bool);
  case TokenID::Int:
    return mk(ast::BuiltinType::Int);
  case TokenID::String:
    return mk(ast::BuiltinType::String);
  default:
    break;
  }
  assert(false);
}